

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O3

void compute_dim_order(int num_dims,int max_dim,int *dim_order)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar7;
  undefined1 auVar6 [16];
  
  auVar1 = _DAT_00155010;
  if (0 < num_dims) {
    lVar2 = (ulong)(uint)num_dims - 1;
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00155010;
    auVar5 = _DAT_00155000;
    do {
      auVar6 = auVar5 ^ auVar1;
      lVar2 = auVar5._8_8_;
      iVar7 = (int)(auVar5._0_8_ + 1);
      if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                  auVar4._4_4_ < auVar6._4_4_) & 1)) {
        if ((long)uVar3 < (long)max_dim) {
          iVar7 = (int)uVar3;
        }
        dim_order[uVar3] = iVar7;
      }
      if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
          auVar6._12_4_ <= auVar4._12_4_) {
        iVar7 = (int)(lVar2 + 1);
        if ((long)(uVar3 + 1) < (long)max_dim) {
          iVar7 = (int)(uVar3 + 1);
        }
        dim_order[uVar3 + 1] = iVar7;
      }
      uVar3 = uVar3 + 2;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar2 + 2;
    } while ((num_dims + 1U & 0xfffffffe) != uVar3);
  }
  dim_order[(long)num_dims + -1] = max_dim;
  return;
}

Assistant:

void compute_dim_order(int num_dims, int max_dim, int *dim_order) {
  for (int i = 0; i < num_dims; i++) {
	if (i < max_dim) {
	  dim_order[i] = i;
	} else {
	  dim_order[i] = i + 1;
	}
  }
  dim_order[num_dims - 1] = max_dim;
}